

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O0

ggml_tensor * get_random_tensor(ggml_context *ctx0,int ndims,int64_t *ne,float fmin,float fmax)

{
  undefined1 auVar1 [16];
  ggml_tensor *pgVar2;
  long *in_RDX;
  undefined4 in_ESI;
  undefined8 in_RDI;
  float in_XMM0_Da;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  float in_XMM1_Da;
  int i0_3;
  int i1_2;
  int i2_1;
  int i3;
  int i0_2;
  int i1_1;
  int i2;
  int i0_1;
  int i1;
  int i0;
  ggml_tensor *result;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  pgVar2 = (ggml_tensor *)ggml_new_tensor(in_RDI,0,in_ESI,in_RDX);
  switch(in_ESI) {
  case 1:
    for (local_2c = 0; (long)local_2c < *in_RDX; local_2c = local_2c + 1) {
      auVar3._0_4_ = frand();
      auVar3._4_60_ = extraout_var;
      auVar1 = vfmadd213ss_fma(ZEXT416((uint)(in_XMM1_Da - in_XMM0_Da)),auVar3._0_16_,
                               ZEXT416((uint)in_XMM0_Da));
      *(int *)((long)pgVar2->data + (long)local_2c * 4) = auVar1._0_4_;
    }
    break;
  case 2:
    for (local_30 = 0; (long)local_30 < in_RDX[1]; local_30 = local_30 + 1) {
      for (local_34 = 0; (long)local_34 < *in_RDX; local_34 = local_34 + 1) {
        auVar4._0_4_ = frand();
        auVar4._4_60_ = extraout_var_00;
        auVar1 = vfmadd213ss_fma(ZEXT416((uint)(in_XMM1_Da - in_XMM0_Da)),auVar4._0_16_,
                                 ZEXT416((uint)in_XMM0_Da));
        *(int *)((long)pgVar2->data + ((long)local_30 * *in_RDX + (long)local_34) * 4) =
             auVar1._0_4_;
      }
    }
    break;
  case 3:
    for (local_38 = 0; (long)local_38 < in_RDX[2]; local_38 = local_38 + 1) {
      for (local_3c = 0; (long)local_3c < in_RDX[1]; local_3c = local_3c + 1) {
        for (local_40 = 0; (long)local_40 < *in_RDX; local_40 = local_40 + 1) {
          auVar5._0_4_ = frand();
          auVar5._4_60_ = extraout_var_01;
          auVar1 = vfmadd213ss_fma(ZEXT416((uint)(in_XMM1_Da - in_XMM0_Da)),auVar5._0_16_,
                                   ZEXT416((uint)in_XMM0_Da));
          *(int *)((long)pgVar2->data +
                  ((long)local_38 * in_RDX[1] * *in_RDX + (long)local_3c * *in_RDX + (long)local_40)
                  * 4) = auVar1._0_4_;
        }
      }
    }
    break;
  case 4:
    for (local_44 = 0; (long)local_44 < in_RDX[3]; local_44 = local_44 + 1) {
      for (local_48 = 0; (long)local_48 < in_RDX[2]; local_48 = local_48 + 1) {
        for (local_4c = 0; (long)local_4c < in_RDX[1]; local_4c = local_4c + 1) {
          for (local_50 = 0; (long)local_50 < *in_RDX; local_50 = local_50 + 1) {
            auVar6._0_4_ = frand();
            auVar6._4_60_ = extraout_var_02;
            auVar1 = vfmadd213ss_fma(ZEXT416((uint)(in_XMM1_Da - in_XMM0_Da)),auVar6._0_16_,
                                     ZEXT416((uint)in_XMM0_Da));
            *(int *)((long)pgVar2->data +
                    ((long)local_44 * in_RDX[2] * in_RDX[1] * *in_RDX +
                     (long)local_48 * in_RDX[1] * *in_RDX + (long)local_4c * *in_RDX +
                    (long)local_50) * 4) = auVar1._0_4_;
          }
        }
      }
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                  ,0x4b,
                  "struct ggml_tensor *get_random_tensor(struct ggml_context *, int, int64_t *, float, float)"
                 );
  }
  return pgVar2;
}

Assistant:

struct ggml_tensor * get_random_tensor(
        struct ggml_context * ctx0,
        int ndims,
        int64_t ne[],
        float fmin,
        float fmax) {
    struct ggml_tensor * result = ggml_new_tensor(ctx0, GGML_TYPE_F32, ndims, ne);

    switch (ndims) {
        case 1:
            for (int i0 = 0; i0 < ne[0]; i0++) {
                ((float *)result->data)[i0] = frand()*(fmax - fmin) + fmin;
            }
            break;
        case 2:
            for (int i1 = 0; i1 < ne[1]; i1++) {
                for (int i0 = 0; i0 < ne[0]; i0++) {
                    ((float *)result->data)[i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                }
            }
            break;
        case 3:
            for (int i2 = 0; i2 < ne[2]; i2++) {
                for (int i1 = 0; i1 < ne[1]; i1++) {
                    for (int i0 = 0; i0 < ne[0]; i0++) {
                        ((float *)result->data)[i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                    }
                }
            }
            break;
        case 4:
            for (int i3 = 0; i3 < ne[3]; i3++) {
                for (int i2 = 0; i2 < ne[2]; i2++) {
                    for (int i1 = 0; i1 < ne[1]; i1++) {
                        for (int i0 = 0; i0 < ne[0]; i0++) {
                            ((float *)result->data)[i3*ne[2]*ne[1]*ne[0] + i2*ne[1]*ne[0] + i1*ne[0] + i0] = frand()*(fmax - fmin) + fmin;
                        }
                    }
                }
            }
            break;
        default:
            assert(false);
    };

    return result;
}